

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::setTimeZone(Calendar *this,TimeZone *zone)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(zone->super_UObject)._vptr_UObject[0xc])(zone);
  if ((TimeZone *)CONCAT44(extraout_var,iVar1) != (TimeZone *)0x0) {
    if (this->fZone != (TimeZone *)0x0) {
      (*(this->fZone->super_UObject)._vptr_UObject[1])();
    }
    this->fZone = (TimeZone *)CONCAT44(extraout_var,iVar1);
    this->fAreFieldsSet = '\0';
  }
  return;
}

Assistant:

void
Calendar::setTimeZone(const TimeZone& zone)
{
    adoptTimeZone(zone.clone());
}